

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

FIOBJ fiobj_str_move(char *str,size_t len,size_t capacity)

{
  undefined1 *puVar1;
  int *piVar2;
  
  puVar1 = (undefined1 *)fio_malloc(0x40);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x28;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 0x18) = 0;
    *(undefined8 *)(puVar1 + 8) = 0;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    *(size_t *)(puVar1 + 0x20) = capacity;
    *(size_t *)(puVar1 + 0x28) = len;
    *(code **)(puVar1 + 0x30) = fio_free;
    *(char **)(puVar1 + 0x38) = str;
    return (ulong)puVar1 | 2;
  }
  perror("ERROR: fiobj string couldn\'t allocate memory");
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

FIOBJ fiobj_str_move(char *str, size_t len, size_t capacity) {
  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT_EXISTING(str, len, capacity),
  };
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}